

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int float64_is_quiet_nan_riscv32(float64 a_,float_status *status)

{
  uint64_t a;
  
  return (int)(0xffe < ((uint)(a_ >> 0x33) & 0xfff));
}

Assistant:

int float64_is_quiet_nan(float64 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float64_is_any_nan(a_);
#else
    uint64_t a = float64_val(a_);
    if (snan_bit_is_one(status)) {
        return (((a >> 51) & 0xFFF) == 0xFFE)
            && (a & 0x0007FFFFFFFFFFFFULL);
    } else {
        return ((a << 1) >= 0xFFF0000000000000ULL);
    }
#endif
}